

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external.c
# Opt level: O1

int vrna_E_ext_loop_5(vrna_fold_compound_t *fc)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  int iVar4;
  vrna_hc_t *pvVar5;
  int *piVar6;
  vrna_param_t *pvVar7;
  vrna_gr_aux_t *pvVar8;
  vrna_sc_t *pvVar9;
  vrna_sc_t **ppvVar10;
  int *piVar11;
  short *psVar12;
  char *pcVar13;
  short **ppsVar14;
  uint **ppuVar15;
  uint *puVar16;
  bool bVar17;
  undefined1 *puVar18;
  undefined1 *puVar19;
  uchar uVar20;
  int iVar21;
  int iVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  int iVar26;
  code *pcVar27;
  void *pvVar28;
  void *pvVar29;
  void *pvVar30;
  ulong uVar31;
  int *piVar32;
  short sVar33;
  uint uVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  code *evaluate;
  int *piVar39;
  long lVar40;
  int (*paiVar41) [5];
  int iVar42;
  int (*paaiVar43) [5] [5];
  int iVar44;
  long lVar45;
  ulong uVar46;
  uint uVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  ulong uVar51;
  ulong uVar52;
  uint uVar53;
  int iVar54;
  long lVar55;
  bool bVar56;
  sc_wrapper_f5 sc_wrapper;
  default_data hc_dat_local;
  ulong local_1b8;
  long local_f0;
  sc_wrapper_f5 local_e8;
  int *local_88;
  long local_80;
  int local_74;
  default_data local_70;
  int (*local_38) [5] [5];
  
  if (fc == (vrna_fold_compound_t *)0x0) {
    return 10000000;
  }
  uVar3 = fc->length;
  pvVar5 = fc->hc;
  piVar6 = (fc->matrices->field_2).field_0.f5;
  pvVar7 = fc->params;
  iVar22 = (pvVar7->model_details).dangles;
  iVar4 = (pvVar7->model_details).gquad;
  uVar53 = (pvVar7->model_details).min_loop_size;
  local_1b8 = (ulong)uVar53;
  pvVar8 = fc->aux_grammar;
  local_70.mx = (pvVar5->field_3).field_0.mx;
  local_70.hc_up = pvVar5->up_ext;
  local_70.sn = fc->strand_number;
  if (pvVar5->f == (vrna_callback_hc_evaluate *)0x0) {
    uVar34 = fc->strands;
    pcVar27 = hc_default;
    evaluate = hc_default_sn;
  }
  else {
    local_70.hc_dat = pvVar5->data;
    uVar34 = fc->strands;
    pcVar27 = hc_default_user;
    evaluate = hc_default_sn_user;
    local_70.hc_f = pvVar5->f;
  }
  if (uVar34 == 1) {
    evaluate = pcVar27;
  }
  local_e8.up = (int **)0x0;
  local_e8.user_cb = (vrna_callback_sc_energy *)0x0;
  local_e8.user_data = (void *)0x0;
  local_e8.n_seq = 1;
  local_e8.red_ext = (code *)0x0;
  local_e8.red_stem = (code *)0x0;
  local_e8.decomp_stem = (code *)0x0;
  local_e8.decomp_stem1 = (code *)0x0;
  local_e8.up_comparative = (int ***)0x0;
  local_e8.user_cb_comparative = (vrna_callback_sc_energy **)0x0;
  local_e8.user_data_comparative = (void **)0x0;
  local_70.n = uVar3;
  if (fc->type == VRNA_FC_TYPE_COMPARATIVE) {
    ppvVar10 = (fc->field_23).field_1.scs;
    local_e8.n_seq = (fc->field_23).field_1.n_seq;
    local_e8.a2s = (fc->field_23).field_1.a2s;
    if (ppvVar10 != (vrna_sc_t **)0x0) {
      local_e8.up_comparative = (int ***)vrna_alloc(local_e8.n_seq << 3);
      local_e8.user_cb_comparative =
           (vrna_callback_sc_energy **)vrna_alloc((fc->field_23).field_1.n_seq << 3);
      local_e8.user_data_comparative = (void **)vrna_alloc((fc->field_23).field_1.n_seq << 3);
      if ((fc->field_23).field_1.n_seq == 0) {
        bVar56 = true;
        bVar17 = true;
      }
      else {
        uVar51 = 0;
        bVar17 = false;
        bVar56 = false;
        do {
          if (ppvVar10[uVar51] != (vrna_sc_t *)0x0) {
            local_e8.up_comparative[uVar51] = ppvVar10[uVar51]->energy_up;
            local_e8.user_cb_comparative[uVar51] = ppvVar10[uVar51]->f;
            local_e8.user_data_comparative[uVar51] = ppvVar10[uVar51]->data;
            if (ppvVar10[uVar51]->energy_up != (int **)0x0) {
              bVar56 = true;
            }
            if (ppvVar10[uVar51]->f != (vrna_callback_sc_energy *)0x0) {
              bVar17 = true;
            }
          }
          uVar51 = uVar51 + 1;
        } while (uVar51 < (fc->field_23).field_1.n_seq);
        bVar56 = !bVar56;
        bVar17 = !bVar17;
      }
      if (bVar56) {
        if (!bVar17) {
          local_e8.decomp_stem1 = sc_user_f5_split_in_ext_stem1_comparative;
          local_e8.decomp_stem = sc_user_f5_split_in_ext_stem_comparative;
          local_e8.red_stem = sc_user_f5_reduce_to_stem_comparative;
          local_e8.red_ext = sc_user_f5_reduce_to_ext_comparative;
        }
      }
      else {
        local_e8.red_ext = sc_user_def_f5_reduce_to_ext_comparative;
        if (bVar17) {
          local_e8.red_ext = sc_default_f5_reduce_comparative;
        }
        local_e8.red_stem = sc_user_def_f5_reduce_to_stem_comparative;
        if (bVar17) {
          local_e8.red_stem = sc_default_f5_reduce_comparative;
        }
        local_e8.decomp_stem = sc_user_def_f5_split_in_ext_stem_comparative;
        if (bVar17) {
          local_e8.decomp_stem = sc_default_f5_split_in_ext_stem_comparative;
        }
        local_e8.decomp_stem1 = sc_user_def_f5_split_in_ext_stem1_comparative;
        if (bVar17) {
          local_e8.decomp_stem1 = sc_default_f5_split_in_ext_stem1_comparative;
        }
      }
    }
  }
  else if ((fc->type == VRNA_FC_TYPE_SINGLE) &&
          (pvVar9 = (fc->field_23).field_0.sc, pvVar9 != (vrna_sc_t *)0x0)) {
    local_e8.up = pvVar9->energy_up;
    local_e8.user_cb = pvVar9->f;
    local_e8.user_data = pvVar9->data;
    if (local_e8.up == (int **)0x0) {
      if (local_e8.user_cb != (vrna_callback_sc_energy *)0x0) {
        local_e8.decomp_stem1 = sc_user_f5_split_in_ext_stem1;
        local_e8.decomp_stem = sc_user_f5_split_in_ext_stem;
        local_e8.red_stem = sc_user_f5_reduce_to_stem;
        local_e8.red_ext = sc_user_f5_reduce_to_ext;
      }
    }
    else {
      bVar56 = local_e8.user_cb == (vrna_callback_sc_energy *)0x0;
      local_e8.red_ext = sc_user_def_f5_reduce_to_ext;
      if (bVar56) {
        local_e8.red_ext = sc_default_f5_reduce;
      }
      local_e8.red_stem = sc_user_def_f5_reduce_to_stem;
      if (bVar56) {
        local_e8.red_stem = sc_default_f5_reduce;
      }
      local_e8.decomp_stem = sc_user_def_f5_split_in_ext_stem;
      if (bVar56) {
        local_e8.decomp_stem = sc_default_f5_split_in_ext_stem;
      }
      local_e8.decomp_stem1 = sc_user_def_f5_split_in_ext_stem1;
      if (bVar56) {
        local_e8.decomp_stem1 = sc_default_f5_split_in_ext_stem1;
      }
    }
  }
  *piVar6 = 0;
  if (-1 < (int)uVar53) {
    lVar45 = 1;
    do {
      iVar21 = reduce_f5_up(fc,(int)lVar45,evaluate,&local_70,&local_e8);
      piVar6[lVar45] = iVar21;
      lVar45 = lVar45 + 1;
    } while (local_1b8 + 2 != lVar45);
  }
  if ((pvVar8 != (vrna_gr_aux_t *)0x0) &&
     (-1 < (int)uVar53 && pvVar8->cb_aux_f != (vrna_callback_gr_rule *)0x0)) {
    lVar45 = 1;
    do {
      iVar21 = (*pvVar8->cb_aux_f)(fc,1,(int)lVar45,pvVar8->data);
      if (piVar6[lVar45] < iVar21) {
        iVar21 = piVar6[lVar45];
      }
      piVar6[lVar45] = iVar21;
      lVar45 = lVar45 + 1;
    } while (local_1b8 + 2 != lVar45);
  }
  iVar21 = uVar53 + 2;
  if (iVar22 == 0) {
    if (iVar21 <= (int)uVar3) {
      lVar45 = (long)iVar21;
      do {
        uVar53 = uVar53 + 1;
        iVar26 = (int)lVar45;
        iVar22 = reduce_f5_up(fc,iVar26,evaluate,&local_70,&local_e8);
        piVar6[lVar45] = iVar22;
        piVar32 = get_stem_contributions_d0(fc,iVar26,evaluate,&local_70,&local_e8);
        iVar21 = vrna_fun_zip_add_min
                           ((fc->matrices->field_2).field_0.f5 + 1,piVar32 + 2,
                            (iVar26 - (fc->params->model_details).min_loop_size) + -2);
        iVar22 = piVar32[1];
        if (iVar21 < piVar32[1]) {
          iVar22 = iVar21;
        }
        free(piVar32);
        if (piVar6[lVar45] < iVar22) {
          iVar22 = piVar6[lVar45];
        }
        piVar6[lVar45] = iVar22;
        if (iVar4 != 0) {
          piVar32 = (fc->matrices->field_2).field_0.ggg;
          uVar34 = (fc->params->model_details).min_loop_size;
          iVar21 = 10000000;
          if (1 < (int)(~uVar34 + iVar26)) {
            iVar54 = iVar26 - uVar34;
            iVar21 = 10000000;
            lVar55 = 0;
            do {
              iVar35 = *(int *)((long)(fc->matrices->field_2).field_0.f5 +
                               lVar55 + (ulong)(uVar53 - uVar34) * 4 + -4);
              if (((iVar35 != 10000000) &&
                  (iVar50 = *(int *)((long)piVar32 +
                                    lVar55 + (long)(int)((fc->jindx[lVar45] + uVar53) - uVar34) * 4)
                  , iVar50 != 10000000)) && (iVar50 = iVar50 + iVar35, iVar50 <= iVar21)) {
                iVar21 = iVar50;
              }
              lVar55 = lVar55 + -4;
              iVar54 = iVar54 + -1;
            } while (2 < iVar54);
          }
          iVar54 = piVar32[(long)fc->jindx[lVar45] + 1];
          if (iVar21 < iVar54) {
            iVar54 = iVar21;
          }
          if (iVar22 < iVar54) {
            iVar54 = iVar22;
          }
          piVar6[lVar45] = iVar54;
        }
        if ((pvVar8 != (vrna_gr_aux_t *)0x0) && (pvVar8->cb_aux_f != (vrna_callback_gr_rule *)0x0))
        {
          iVar22 = (*pvVar8->cb_aux_f)(fc,1,iVar26,pvVar8->data);
          if (piVar6[lVar45] < iVar22) {
            iVar22 = piVar6[lVar45];
          }
          piVar6[lVar45] = iVar22;
        }
        lVar45 = lVar45 + 1;
      } while (uVar3 + 1 != (int)lVar45);
    }
  }
  else if (iVar22 == 2) {
    if (iVar21 <= (int)uVar3) {
      uVar51 = (ulong)iVar21;
      local_f0 = uVar51 * 2 + -4;
      do {
        uVar53 = uVar53 + 1;
        iVar21 = (int)uVar51;
        iVar22 = reduce_f5_up(fc,iVar21,evaluate,&local_70,&local_e8);
        piVar6[uVar51] = iVar22;
        pvVar28 = vrna_alloc(iVar21 * 4);
        puVar19 = local_e8.decomp_stem;
        puVar18 = local_e8.red_stem;
        uVar34 = fc->length;
        pvVar7 = fc->params;
        piVar32 = fc->jindx;
        piVar11 = (fc->matrices->field_2).field_0.c;
        uVar47 = (pvVar7->model_details).min_loop_size;
        iVar22 = piVar32[uVar51];
        uVar23 = ~uVar47 + iVar21;
        iVar26 = (int)local_1b8;
        if (fc->type == VRNA_FC_TYPE_COMPARATIVE) {
          uVar24 = (fc->field_23).field_1.n_seq;
          uVar46 = (ulong)uVar24;
          pcVar13 = (fc->field_23).field_0.ptype_pf_compat;
          pvVar9 = (fc->field_23).field_0.sc;
          ppsVar14 = (fc->field_23).field_1.S3;
          ppuVar15 = (fc->field_23).field_1.a2s;
          uVar24 = uVar24 * 2;
          pvVar29 = vrna_alloc(uVar24);
          pvVar30 = vrna_alloc(uVar24);
          if (uVar46 != 0) {
            uVar31 = 0;
            do {
              puVar16 = ppuVar15[uVar31];
              sVar33 = -1;
              if (puVar16[uVar51] < puVar16[(int)uVar34]) {
                sVar33 = ppsVar14[uVar31][uVar51];
              }
              *(short *)((long)pvVar29 + uVar31 * 2) = sVar33;
              *(undefined2 *)((long)pvVar30 + uVar31 * 2) =
                   *(undefined2 *)(*(long *)(pcVar13 + uVar31 * 8) + uVar51 * 2);
              uVar31 = uVar31 + 1;
            } while (uVar46 != uVar31);
          }
          if (1 < (int)uVar23) {
            uVar31 = (ulong)uVar23;
            lVar45 = (long)(int)(iVar22 + uVar23);
            do {
              *(undefined4 *)((long)pvVar28 + uVar31 * 4) = 10000000;
              iVar22 = (int)uVar31;
              if (((piVar11[lVar45] != 10000000) &&
                  (uVar20 = (*evaluate)(1,iVar21,iVar22 + -1,iVar22,'\x12',&local_70),
                  uVar20 != '\0')) &&
                 (*(int *)((long)pvVar28 + uVar31 * 4) = piVar11[lVar45], uVar46 != 0)) {
                uVar52 = 0;
                do {
                  uVar24 = vrna_get_ptype_md((int)*(short *)(*(long *)(pcVar13 + uVar52 * 8) +
                                                            uVar31 * 2),
                                             (int)*(short *)((long)pvVar30 + uVar52 * 2),
                                             &pvVar7->model_details);
                  uVar34 = 0xffffffff;
                  if (1 < ppuVar15[uVar52][uVar31]) {
                    uVar34 = (uint)*(short *)(*(long *)(&pvVar9->type + uVar52 * 2) + uVar31 * 2);
                  }
                  sVar33 = *(short *)((long)pvVar29 + uVar52 * 2);
                  if ((int)(uVar34 | (int)sVar33) < 0) {
                    if (-1 < (int)uVar34) {
                      piVar39 = pvVar7->dangle5[uVar24] + uVar34;
                      goto LAB_0011abf7;
                    }
                    paaiVar43 = (int (*) [5] [5])pvVar7->dangle3;
                    uVar34 = uVar24;
                    if (-1 < sVar33) goto LAB_0011abd4;
                    iVar54 = 0;
                  }
                  else {
                    paaiVar43 = pvVar7->mismatchExt + uVar24;
LAB_0011abd4:
                    piVar39 = (*paaiVar43)[uVar34] + (uint)(int)sVar33;
LAB_0011abf7:
                    iVar54 = *piVar39;
                  }
                  if (2 < uVar24) {
                    iVar54 = iVar54 + pvVar7->TerminalAU;
                  }
                  piVar39 = (int *)((long)pvVar28 + uVar31 * 4);
                  *piVar39 = *piVar39 + iVar54;
                  uVar52 = uVar52 + 1;
                } while (uVar46 != uVar52);
              }
              uVar31 = uVar31 - 1;
              lVar45 = lVar45 + -1;
            } while (2 < iVar22);
          }
          if ((code *)puVar19 != (code *)0x0 && 1 < (int)uVar23) {
            uVar31 = (ulong)uVar23;
            iVar22 = iVar21 - uVar47;
            iVar54 = iVar26 - uVar47;
            do {
              if (*(int *)((long)pvVar28 + uVar31 * 4) != 10000000) {
                iVar35 = (*(code *)puVar19)(uVar51 & 0xffffffff,iVar54,uVar31 & 0xffffffff,&local_e8
                                           );
                piVar39 = (int *)((long)pvVar28 + uVar31 * 4);
                *piVar39 = *piVar39 + iVar35;
              }
              uVar31 = uVar31 - 1;
              iVar22 = iVar22 + -1;
              iVar54 = iVar54 + -1;
            } while (2 < iVar22);
          }
          *(undefined4 *)((long)pvVar28 + 4) = 10000000;
          iVar22 = piVar32[uVar51];
          if ((piVar11[(long)iVar22 + 1] != 10000000) &&
             (uVar20 = (*evaluate)(1,iVar21,1,iVar21,'\x0e',&local_70), uVar20 != '\0')) {
            *(int *)((long)pvVar28 + 4) = piVar11[(long)iVar22 + 1];
            if (uVar46 != 0) {
              uVar31 = 0;
              do {
                uVar34 = vrna_get_ptype_md((int)*(short *)(*(long *)(pcVar13 + uVar31 * 8) + 2),
                                           (int)*(short *)((long)pvVar30 + uVar31 * 2),
                                           &pvVar7->model_details);
                lVar45 = (long)*(short *)((long)pvVar29 + uVar31 * 2);
                if (lVar45 < 0) {
                  iVar22 = 0;
                }
                else {
                  iVar22 = pvVar7->dangle3[uVar34][lVar45];
                }
                if (2 < uVar34) {
                  iVar22 = iVar22 + pvVar7->TerminalAU;
                }
                *(int *)((long)pvVar28 + 4) = *(int *)((long)pvVar28 + 4) + iVar22;
                uVar31 = uVar31 + 1;
              } while (uVar46 != uVar31);
            }
            if ((code *)puVar18 != (code *)0x0) {
              iVar22 = (*(code *)puVar18)(uVar51 & 0xffffffff,1,uVar51 & 0xffffffff,&local_e8);
              *(int *)((long)pvVar28 + 4) = *(int *)((long)pvVar28 + 4) + iVar22;
            }
          }
          free(pvVar29);
          free(pvVar30);
        }
        else if (fc->type == VRNA_FC_TYPE_SINGLE) {
          psVar12 = (fc->field_23).field_0.sequence_encoding;
          uVar24 = 0xffffffff;
          if ((long)uVar51 < (long)(int)uVar34) {
            uVar24 = (uint)psVar12[uVar51 + 1];
          }
          pcVar13 = (fc->field_23).field_0.ptype;
          if (1 < (int)uVar23) {
            iVar22 = (iVar22 + uVar53) - uVar47;
            iVar54 = iVar21 - uVar47;
            lVar45 = 0;
            do {
              *(undefined4 *)((long)pvVar28 + lVar45 * 4 + (ulong)(uVar53 - uVar47) * 4) = 10000000;
              if (piVar11[iVar22 + lVar45] != 10000000) {
                iVar35 = (int)lVar45;
                uVar20 = (*evaluate)(1,iVar21,(iVar26 - uVar47) + iVar35,
                                     (iVar26 - uVar47) + iVar35 + 1,'\x12',&local_70);
                if (uVar20 != '\0') {
                  uVar25 = vrna_get_ptype(iVar22 + iVar35,pcVar13);
                  sVar33 = *(short *)((long)psVar12 + lVar45 * 2 + local_f0 + (long)(int)uVar47 * -2
                                     );
                  uVar34 = (uint)sVar33;
                  if ((int)(uVar24 | uVar34) < 0) {
                    if (-1 < sVar33) {
                      piVar39 = pvVar7->dangle5[uVar25] + uVar34;
                      goto LAB_0011a8b7;
                    }
                    paaiVar43 = (int (*) [5] [5])pvVar7->dangle3;
                    uVar34 = uVar25;
                    if (-1 < (int)uVar24) goto LAB_0011a88e;
                    iVar35 = 0;
                  }
                  else {
                    paaiVar43 = pvVar7->mismatchExt + uVar25;
LAB_0011a88e:
                    piVar39 = (*paaiVar43)[uVar34] + uVar24;
LAB_0011a8b7:
                    iVar35 = *piVar39;
                  }
                  if (2 < uVar25) {
                    iVar35 = iVar35 + pvVar7->TerminalAU;
                  }
                  *(int *)((long)pvVar28 + lVar45 * 4 + (ulong)(uVar53 - uVar47) * 4) =
                       iVar35 + piVar11[iVar22 + lVar45];
                }
              }
              lVar45 = lVar45 + -1;
              iVar54 = iVar54 + -1;
            } while (2 < iVar54);
          }
          if ((code *)puVar19 != (code *)0x0 && 1 < (int)uVar23) {
            uVar46 = (ulong)uVar23;
            iVar22 = iVar21 - uVar47;
            iVar54 = iVar26 - uVar47;
            do {
              if (*(int *)((long)pvVar28 + uVar46 * 4) != 10000000) {
                iVar35 = (*(code *)puVar19)(uVar51 & 0xffffffff,iVar54,uVar46 & 0xffffffff,&local_e8
                                           );
                piVar39 = (int *)((long)pvVar28 + uVar46 * 4);
                *piVar39 = *piVar39 + iVar35;
              }
              uVar46 = uVar46 - 1;
              iVar22 = iVar22 + -1;
              iVar54 = iVar54 + -1;
            } while (2 < iVar22);
          }
          *(undefined4 *)((long)pvVar28 + 4) = 10000000;
          iVar22 = piVar32[uVar51];
          if ((piVar11[(long)iVar22 + 1] != 10000000) &&
             (uVar20 = (*evaluate)(1,iVar21,1,iVar21,'\x0e',&local_70), uVar20 != '\0')) {
            uVar34 = vrna_get_ptype(iVar22 + 1,pcVar13);
            if ((int)uVar24 < 0) {
              iVar54 = 0;
            }
            else {
              iVar54 = pvVar7->dangle3[uVar34][uVar24];
            }
            if (2 < uVar34) {
              iVar54 = iVar54 + pvVar7->TerminalAU;
            }
            *(int *)((long)pvVar28 + 4) = iVar54 + piVar11[(long)iVar22 + 1];
            if ((code *)puVar18 != (code *)0x0) {
              iVar22 = (*(code *)puVar18)(uVar51 & 0xffffffff,1,uVar51 & 0xffffffff,&local_e8);
              *(int *)((long)pvVar28 + 4) = *(int *)((long)pvVar28 + 4) + iVar22;
            }
          }
        }
        iVar54 = vrna_fun_zip_add_min
                           ((fc->matrices->field_2).field_0.f5 + 1,(int *)((long)pvVar28 + 8),
                            (iVar21 - (fc->params->model_details).min_loop_size) + -2);
        iVar22 = *(int *)((long)pvVar28 + 4);
        if (iVar54 < *(int *)((long)pvVar28 + 4)) {
          iVar22 = iVar54;
        }
        free(pvVar28);
        if (piVar6[uVar51] < iVar22) {
          iVar22 = piVar6[uVar51];
        }
        piVar6[uVar51] = iVar22;
        if (iVar4 != 0) {
          piVar32 = (fc->matrices->field_2).field_0.ggg;
          uVar34 = (fc->params->model_details).min_loop_size;
          iVar54 = 10000000;
          if (1 < (int)(~uVar34 + iVar21)) {
            iVar35 = iVar21 - uVar34;
            iVar54 = 10000000;
            lVar45 = 0;
            do {
              iVar50 = *(int *)((long)(fc->matrices->field_2).field_0.f5 +
                               lVar45 + (ulong)(uVar53 - uVar34) * 4 + -4);
              if (((iVar50 != 10000000) &&
                  (iVar49 = *(int *)((long)piVar32 +
                                    lVar45 + (long)(int)((fc->jindx[uVar51] + uVar53) - uVar34) * 4)
                  , iVar49 != 10000000)) && (iVar49 = iVar49 + iVar50, iVar49 <= iVar54)) {
                iVar54 = iVar49;
              }
              lVar45 = lVar45 + -4;
              iVar35 = iVar35 + -1;
            } while (2 < iVar35);
          }
          iVar35 = piVar32[(long)fc->jindx[uVar51] + 1];
          if (iVar54 < iVar35) {
            iVar35 = iVar54;
          }
          if (iVar22 < iVar35) {
            iVar35 = iVar22;
          }
          piVar6[uVar51] = iVar35;
        }
        if ((pvVar8 != (vrna_gr_aux_t *)0x0) && (pvVar8->cb_aux_f != (vrna_callback_gr_rule *)0x0))
        {
          iVar22 = (*pvVar8->cb_aux_f)(fc,1,iVar21,pvVar8->data);
          if (piVar6[uVar51] < iVar22) {
            iVar22 = piVar6[uVar51];
          }
          piVar6[uVar51] = iVar22;
        }
        uVar51 = uVar51 + 1;
        local_1b8 = (ulong)(iVar26 + 1);
        local_f0 = local_f0 + 2;
      } while (uVar3 + 1 != (int)uVar51);
    }
  }
  else if (iVar21 <= (int)uVar3) {
    uVar51 = (ulong)iVar21;
    local_74 = uVar3 + 1;
    local_80 = uVar51 * 2 + -2;
    do {
      uVar53 = uVar53 + 1;
      iVar35 = (int)uVar51;
      iVar22 = reduce_f5_up(fc,iVar35,evaluate,&local_70,&local_e8);
      piVar6[uVar51] = iVar22;
      piVar32 = get_stem_contributions_d0(fc,iVar35,evaluate,&local_70,&local_e8);
      iVar54 = iVar35 + -2;
      iVar26 = vrna_fun_zip_add_min
                         ((fc->matrices->field_2).field_0.f5 + 1,piVar32 + 2,
                          iVar54 - (fc->params->model_details).min_loop_size);
      iVar22 = piVar32[1];
      free(piVar32);
      uVar47 = iVar35 * 4;
      pvVar28 = vrna_alloc(uVar47);
      puVar19 = local_e8.decomp_stem;
      puVar18 = local_e8.red_stem;
      pvVar7 = fc->params;
      piVar32 = fc->jindx;
      piVar11 = (fc->matrices->field_2).field_0.c;
      uVar34 = (pvVar7->model_details).min_loop_size;
      iVar21 = piVar32[uVar51];
      iVar50 = (int)local_1b8;
      if (fc->type == VRNA_FC_TYPE_COMPARATIVE) {
        uVar23 = (fc->field_23).field_1.n_seq;
        uVar46 = (ulong)uVar23;
        pcVar13 = (fc->field_23).field_0.ptype_pf_compat;
        pvVar9 = (fc->field_23).field_0.sc;
        ppuVar15 = (fc->field_23).field_1.a2s;
        pvVar29 = vrna_alloc(uVar23 * 2);
        if (uVar46 != 0) {
          uVar31 = 0;
          do {
            *(undefined2 *)((long)pvVar29 + uVar31 * 2) =
                 *(undefined2 *)(*(long *)(pcVar13 + uVar31 * 8) + uVar51 * 2);
            uVar31 = uVar31 + 1;
          } while (uVar46 != uVar31);
        }
        uVar24 = ~uVar34 + iVar35;
        uVar23 = uVar24;
        if (1 < (int)uVar24) {
          uVar31 = (ulong)uVar24;
          lVar45 = (long)(int)((iVar35 - uVar34) + iVar21);
          do {
            *(undefined4 *)((long)pvVar28 + uVar31 * 4) = 10000000;
            iVar21 = (int)uVar31;
            if (((piVar11[lVar45] != 10000000) &&
                (uVar20 = (*evaluate)(1,iVar35,iVar21 + -1,iVar21 + 1,'\x12',&local_70),
                uVar20 != '\0')) &&
               (*(int *)((long)pvVar28 + uVar31 * 4) = piVar11[lVar45], uVar46 != 0)) {
              uVar52 = 0;
              do {
                uVar23 = vrna_get_ptype_md((int)*(short *)(*(long *)(pcVar13 + uVar52 * 8) + 2 +
                                                          uVar31 * 2),
                                           (int)*(short *)((long)pvVar29 + uVar52 * 2),
                                           &pvVar7->model_details);
                uVar25 = 0xffffffff;
                if (1 < ppuVar15[uVar52][uVar31 + 1]) {
                  uVar25 = (uint)*(short *)(*(long *)(&pvVar9->type + uVar52 * 2) + 2 + uVar31 * 2);
                }
                if ((int)uVar25 < 0) {
                  iVar49 = 0;
                }
                else {
                  iVar49 = pvVar7->dangle5[uVar23][uVar25];
                }
                if (2 < uVar23) {
                  iVar49 = iVar49 + pvVar7->TerminalAU;
                }
                *(int *)((long)pvVar28 + uVar31 * 4) = iVar49;
                uVar52 = uVar52 + 1;
              } while (uVar46 != uVar52);
            }
            uVar31 = uVar31 - 1;
            lVar45 = lVar45 + -1;
          } while (2 < iVar21);
          uVar23 = 1;
        }
        if ((code *)puVar19 != (code *)0x0) {
          uVar23 = uVar24;
        }
        if ((code *)puVar19 != (code *)0x0 && 1 < (int)uVar24) {
          iVar21 = iVar35 - uVar34;
          iVar49 = iVar50 - uVar34;
          piVar39 = (int *)((long)pvVar28 + (ulong)(uVar53 - uVar34) * 4);
          do {
            if (*piVar39 != 10000000) {
              iVar36 = (*(code *)puVar19)(uVar51,iVar49,iVar21,&local_e8);
              *piVar39 = *piVar39 + iVar36;
            }
            iVar21 = iVar21 + -1;
            iVar49 = iVar49 + -1;
            piVar39 = piVar39 + -1;
          } while (2 < iVar21);
          uVar23 = 1;
        }
        *(undefined4 *)((long)pvVar28 + 4) = 10000000;
        iVar21 = piVar32[uVar51];
        if ((piVar11[(long)iVar21 + 2] != 10000000) &&
           (uVar20 = (*evaluate)(1,iVar35,2,iVar35,'\x0e',&local_70), uVar20 != '\0')) {
          *(int *)((long)pvVar28 + 4) = piVar11[(long)iVar21 + 2];
          if (uVar46 != 0) {
            uVar31 = 0;
            do {
              uVar34 = vrna_get_ptype_md((int)*(short *)(*(long *)(pcVar13 + uVar31 * 8) + 4),
                                         (int)*(short *)((long)pvVar29 + uVar31 * 2),
                                         &pvVar7->model_details);
              uVar24 = 0xffffffff;
              if (1 < ppuVar15[uVar31][2]) {
                uVar24 = (uint)*(short *)(*(long *)(&pvVar9->type + uVar31 * 2) + 4);
              }
              if ((int)uVar24 < 0) {
                iVar21 = 0;
              }
              else {
                iVar21 = pvVar7->dangle5[uVar34][uVar24];
              }
              if (2 < uVar34) {
                iVar21 = iVar21 + pvVar7->TerminalAU;
              }
              *(int *)((long)pvVar28 + (long)(int)uVar23 * 4) = iVar21;
              uVar31 = uVar31 + 1;
            } while (uVar46 != uVar31);
          }
          if ((code *)puVar18 != (code *)0x0) {
            iVar21 = (*(code *)puVar18)(uVar51,2,uVar51 & 0xffffffff,&local_e8);
            *(int *)((long)pvVar28 + 4) = *(int *)((long)pvVar28 + 4) + iVar21;
          }
        }
        free(pvVar29);
      }
      else if (fc->type == VRNA_FC_TYPE_SINGLE) {
        psVar12 = (fc->field_23).field_0.sequence_encoding;
        pcVar13 = (fc->field_23).field_0.ptype;
        if (1 < (int)(~uVar34 + iVar35)) {
          iVar21 = (iVar21 + iVar35) - uVar34;
          iVar49 = iVar35 - uVar34;
          lVar45 = local_80 + (long)(int)uVar34 * -2;
          lVar55 = 0;
          do {
            *(undefined4 *)((long)pvVar28 + lVar55 * 4 + (ulong)(uVar53 - uVar34) * 4) = 10000000;
            if (piVar11[iVar21 + lVar55] != 10000000) {
              uVar20 = (*evaluate)(1,iVar35,(iVar50 - uVar34) + (int)lVar55,iVar49,'\x12',&local_70)
              ;
              if (uVar20 != '\0') {
                uVar23 = vrna_get_ptype(iVar21 + (int)lVar55,pcVar13);
                lVar40 = (long)*(short *)((long)psVar12 + lVar55 * 2 + lVar45);
                if (lVar40 < 0) {
                  iVar36 = 0;
                }
                else {
                  iVar36 = pvVar7->dangle5[uVar23][lVar40];
                }
                if (2 < uVar23) {
                  iVar36 = iVar36 + pvVar7->TerminalAU;
                }
                *(int *)((long)pvVar28 + lVar55 * 4 + (ulong)(uVar53 - uVar34) * 4) =
                     iVar36 + piVar11[iVar21 + lVar55];
              }
            }
            lVar55 = lVar55 + -1;
            iVar49 = iVar49 + -1;
          } while (2 < iVar49);
        }
        if ((code *)puVar19 != (code *)0x0 && 1 < (int)(~uVar34 + iVar35)) {
          iVar21 = iVar35 - uVar34;
          iVar49 = iVar50 - uVar34;
          piVar39 = (int *)((long)pvVar28 + (ulong)(uVar53 - uVar34) * 4);
          do {
            if (*piVar39 != 10000000) {
              iVar36 = (*(code *)puVar19)(uVar51,iVar49,iVar21,&local_e8);
              *piVar39 = *piVar39 + iVar36;
            }
            iVar21 = iVar21 + -1;
            iVar49 = iVar49 + -1;
            piVar39 = piVar39 + -1;
          } while (2 < iVar21);
        }
        *(undefined4 *)((long)pvVar28 + 4) = 10000000;
        iVar21 = piVar32[uVar51];
        if ((piVar11[(long)iVar21 + 2] != 10000000) &&
           (uVar20 = (*evaluate)(1,iVar35,2,iVar35,'\x0e',&local_70), uVar20 != '\0')) {
          uVar34 = vrna_get_ptype(iVar21 + 2,pcVar13);
          lVar45 = (long)psVar12[1];
          if (lVar45 < 0) {
            iVar49 = 0;
          }
          else {
            iVar49 = pvVar7->dangle5[uVar34][lVar45];
          }
          if (2 < uVar34) {
            iVar49 = iVar49 + pvVar7->TerminalAU;
          }
          *(int *)((long)pvVar28 + 4) = iVar49 + piVar11[(long)iVar21 + 2];
          if ((code *)puVar18 != (code *)0x0) {
            iVar21 = (*(code *)puVar18)(uVar51,2,uVar51 & 0xffffffff,&local_e8);
            *(int *)((long)pvVar28 + 4) = *(int *)((long)pvVar28 + 4) + iVar21;
          }
        }
      }
      iVar36 = vrna_fun_zip_add_min
                         ((fc->matrices->field_2).field_0.f5 + 1,(int *)((long)pvVar28 + 8),
                          iVar54 - (fc->params->model_details).min_loop_size);
      iVar21 = *(int *)((long)pvVar28 + 4);
      free(pvVar28);
      pvVar28 = vrna_alloc(uVar47);
      puVar19 = local_e8.decomp_stem1;
      puVar18 = local_e8.red_stem;
      pvVar7 = fc->params;
      piVar32 = fc->jindx;
      piVar11 = (fc->matrices->field_2).field_0.c;
      uVar34 = (pvVar7->model_details).min_loop_size;
      iVar42 = iVar35 + -1;
      iVar49 = piVar32[uVar51 - 1];
      uVar23 = ~uVar34 + iVar35;
      if (fc->type == VRNA_FC_TYPE_COMPARATIVE) {
        uVar24 = fc->length;
        uVar25 = (fc->field_23).field_1.n_seq;
        uVar46 = (ulong)uVar25;
        pcVar13 = (fc->field_23).field_0.ptype_pf_compat;
        ppsVar14 = (fc->field_23).field_1.S3;
        ppuVar15 = (fc->field_23).field_1.a2s;
        uVar25 = uVar25 * 2;
        pvVar29 = vrna_alloc(uVar25);
        pvVar30 = vrna_alloc(uVar25);
        if (uVar46 != 0) {
          uVar31 = 0;
          do {
            puVar16 = ppuVar15[uVar31];
            sVar33 = -1;
            if (puVar16[uVar51 - 1] < puVar16[uVar24]) {
              sVar33 = ppsVar14[uVar31][uVar51 - 1];
            }
            *(short *)((long)pvVar29 + uVar31 * 2) = sVar33;
            *(undefined2 *)((long)pvVar30 + uVar31 * 2) =
                 *(undefined2 *)(*(long *)(pcVar13 + uVar31 * 8) + -2 + uVar51 * 2);
            uVar31 = uVar31 + 1;
          } while (uVar46 != uVar31);
        }
        if (1 < (int)uVar23) {
          uVar31 = (ulong)uVar23;
          lVar45 = (long)(int)(iVar49 + uVar23);
          do {
            *(undefined4 *)((long)pvVar28 + uVar31 * 4) = 10000000;
            iVar49 = (int)uVar31;
            if (((piVar11[lVar45] != 10000000) &&
                (uVar20 = (*evaluate)(1,iVar35,iVar49 + -1,iVar49,'\x13',&local_70), uVar20 != '\0')
                ) && (*(int *)((long)pvVar28 + uVar31 * 4) = piVar11[lVar45], uVar46 != 0)) {
              uVar52 = 0;
              do {
                uVar24 = vrna_get_ptype_md((int)*(short *)(*(long *)(pcVar13 + uVar52 * 8) +
                                                          uVar31 * 2),
                                           (int)*(short *)((long)pvVar30 + uVar52 * 2),
                                           &pvVar7->model_details);
                lVar55 = (long)*(short *)((long)pvVar29 + uVar52 * 2);
                if (lVar55 < 0) {
                  iVar48 = 0;
                }
                else {
                  iVar48 = pvVar7->dangle3[uVar24][lVar55];
                }
                if (2 < uVar24) {
                  iVar48 = iVar48 + pvVar7->TerminalAU;
                }
                piVar39 = (int *)((long)pvVar28 + uVar31 * 4);
                *piVar39 = *piVar39 + iVar48;
                uVar52 = uVar52 + 1;
              } while (uVar46 != uVar52);
            }
            uVar31 = uVar31 - 1;
            lVar45 = lVar45 + -1;
          } while (2 < iVar49);
        }
        if ((code *)puVar19 != (code *)0x0 && 1 < (int)uVar23) {
          uVar31 = (ulong)uVar23;
          iVar49 = iVar35 - uVar34;
          iVar48 = iVar50 - uVar34;
          do {
            if (*(int *)((long)pvVar28 + uVar31 * 4) != 10000000) {
              iVar37 = (*(code *)puVar19)(uVar51,iVar48,uVar31 & 0xffffffff,&local_e8);
              piVar39 = (int *)((long)pvVar28 + uVar31 * 4);
              *piVar39 = *piVar39 + iVar37;
            }
            uVar31 = uVar31 - 1;
            iVar49 = iVar49 + -1;
            iVar48 = iVar48 + -1;
          } while (2 < iVar49);
        }
        *(undefined4 *)((long)pvVar28 + 4) = 10000000;
        iVar49 = piVar32[uVar51 - 1];
        if ((piVar11[(long)iVar49 + 1] != 10000000) &&
           (uVar20 = (*evaluate)(1,iVar35,1,iVar42,'\x0e',&local_70), uVar20 != '\0')) {
          *(int *)((long)pvVar28 + 4) = piVar11[(long)iVar49 + 1];
          if (uVar46 != 0) {
            uVar31 = 0;
            do {
              uVar34 = vrna_get_ptype_md((int)*(short *)(*(long *)(pcVar13 + uVar31 * 8) + 2),
                                         (int)*(short *)((long)pvVar30 + uVar31 * 2),
                                         &pvVar7->model_details);
              lVar45 = (long)*(short *)((long)pvVar29 + uVar31 * 2);
              if (lVar45 < 0) {
                iVar49 = 0;
              }
              else {
                iVar49 = pvVar7->dangle3[uVar34][lVar45];
              }
              if (2 < uVar34) {
                iVar49 = iVar49 + pvVar7->TerminalAU;
              }
              *(int *)((long)pvVar28 + 4) = *(int *)((long)pvVar28 + 4) + iVar49;
              uVar31 = uVar31 + 1;
            } while (uVar46 != uVar31);
          }
          if ((code *)puVar18 != (code *)0x0) {
            iVar49 = (*(code *)puVar18)(uVar51,1,iVar42,&local_e8);
            *(int *)((long)pvVar28 + 4) = *(int *)((long)pvVar28 + 4) + iVar49;
          }
        }
        free(pvVar29);
        free(pvVar30);
      }
      else if (fc->type == VRNA_FC_TYPE_SINGLE) {
        pcVar13 = (fc->field_23).field_0.ptype;
        uVar1 = (fc->field_23).field_0.sequence_encoding[uVar51];
        if (1 < (int)uVar23) {
          iVar49 = (iVar49 + uVar53) - uVar34;
          iVar48 = iVar35 - uVar34;
          lVar45 = 0;
          do {
            *(undefined4 *)((long)pvVar28 + lVar45 * 4 + (ulong)(uVar53 - uVar34) * 4) = 10000000;
            if (piVar11[iVar49 + lVar45] != 10000000) {
              iVar37 = (int)lVar45;
              uVar20 = (*evaluate)(1,iVar35,iVar37 + (iVar50 - uVar34),
                                   iVar37 + (iVar50 - uVar34) + 1,'\x13',&local_70);
              if (uVar20 != '\0') {
                uVar24 = vrna_get_ptype(iVar49 + iVar37,pcVar13);
                if ((short)uVar1 < 0) {
                  iVar37 = 0;
                }
                else {
                  iVar37 = pvVar7->dangle3[uVar24][uVar1];
                }
                if (2 < uVar24) {
                  iVar37 = iVar37 + pvVar7->TerminalAU;
                }
                *(int *)((long)pvVar28 + lVar45 * 4 + (ulong)(uVar53 - uVar34) * 4) =
                     iVar37 + piVar11[iVar49 + lVar45];
              }
            }
            lVar45 = lVar45 + -1;
            iVar48 = iVar48 + -1;
          } while (2 < iVar48);
        }
        if ((code *)puVar19 != (code *)0x0 && 1 < (int)uVar23) {
          uVar46 = (ulong)uVar23;
          iVar49 = iVar35 - uVar34;
          iVar48 = iVar50 - uVar34;
          do {
            if (*(int *)((long)pvVar28 + uVar46 * 4) != 10000000) {
              iVar37 = (*(code *)puVar19)(uVar51,iVar48,uVar46 & 0xffffffff,&local_e8);
              piVar39 = (int *)((long)pvVar28 + uVar46 * 4);
              *piVar39 = *piVar39 + iVar37;
            }
            uVar46 = uVar46 - 1;
            iVar49 = iVar49 + -1;
            iVar48 = iVar48 + -1;
          } while (2 < iVar49);
        }
        *(undefined4 *)((long)pvVar28 + 4) = 10000000;
        iVar49 = piVar32[uVar51 - 1];
        if ((piVar11[(long)iVar49 + 1] != 10000000) &&
           (uVar20 = (*evaluate)(1,iVar35,1,iVar42,'\x0e',&local_70), uVar20 != '\0')) {
          uVar34 = vrna_get_ptype(iVar49 + 1,pcVar13);
          if ((short)uVar1 < 0) {
            iVar48 = 0;
          }
          else {
            iVar48 = pvVar7->dangle3[uVar34][uVar1];
          }
          if (2 < uVar34) {
            iVar48 = iVar48 + pvVar7->TerminalAU;
          }
          *(int *)((long)pvVar28 + 4) = iVar48 + piVar11[(long)iVar49 + 1];
          if ((code *)puVar18 != (code *)0x0) {
            iVar49 = (*(code *)puVar18)(uVar51,1,iVar42,&local_e8);
            *(int *)((long)pvVar28 + 4) = *(int *)((long)pvVar28 + 4) + iVar49;
          }
        }
      }
      iVar37 = vrna_fun_zip_add_min
                         ((fc->matrices->field_2).field_0.f5 + 1,(int *)((long)pvVar28 + 8),
                          iVar54 - (fc->params->model_details).min_loop_size);
      iVar49 = *(int *)((long)pvVar28 + 4);
      free(pvVar28);
      pvVar28 = vrna_alloc(uVar47);
      puVar19 = local_e8.decomp_stem1;
      puVar18 = local_e8.red_stem;
      pvVar7 = fc->params;
      piVar32 = fc->jindx;
      piVar11 = (fc->matrices->field_2).field_0.c;
      uVar34 = (pvVar7->model_details).min_loop_size;
      iVar48 = piVar32[uVar51 - 1];
      if (fc->type == VRNA_FC_TYPE_COMPARATIVE) {
        uVar47 = fc->length;
        uVar23 = (fc->field_23).field_1.n_seq;
        uVar46 = (ulong)uVar23;
        pcVar13 = (fc->field_23).field_0.ptype_pf_compat;
        pvVar9 = (fc->field_23).field_0.sc;
        ppsVar14 = (fc->field_23).field_1.S3;
        ppuVar15 = (fc->field_23).field_1.a2s;
        uVar23 = uVar23 * 2;
        pvVar29 = vrna_alloc(uVar23);
        pvVar30 = vrna_alloc(uVar23);
        if (uVar46 != 0) {
          uVar31 = 0;
          do {
            sVar33 = -1;
            if (ppuVar15[uVar31][uVar51 - 1] < ppuVar15[uVar31][uVar47]) {
              sVar33 = ppsVar14[uVar31][uVar51 - 1];
            }
            *(short *)((long)pvVar29 + uVar31 * 2) = sVar33;
            *(undefined2 *)((long)pvVar30 + uVar31 * 2) =
                 *(undefined2 *)(*(long *)(pcVar13 + uVar31 * 8) + -2 + uVar51 * 2);
            uVar31 = uVar31 + 1;
          } while (uVar46 != uVar31);
        }
        uVar47 = ~uVar34 + iVar35;
        local_88 = piVar32;
        if (1 < (int)uVar47) {
          uVar31 = (ulong)uVar47;
          lVar45 = (long)(int)((iVar35 - uVar34) + iVar48);
          do {
            *(undefined4 *)((long)pvVar28 + uVar31 * 4) = 10000000;
            iVar48 = (int)uVar31;
            if (((piVar11[lVar45] != 10000000) &&
                (uVar20 = (*evaluate)(1,iVar35,iVar48 + -1,iVar48 + 1,'\x13',&local_70),
                uVar20 != '\0')) &&
               (*(int *)((long)pvVar28 + uVar31 * 4) = piVar11[lVar45], uVar46 != 0)) {
              uVar52 = 0;
              do {
                uVar24 = vrna_get_ptype_md((int)*(short *)(*(long *)(pcVar13 + uVar52 * 8) + 2 +
                                                          uVar31 * 2),
                                           (int)*(short *)((long)pvVar30 + uVar52 * 2),
                                           &pvVar7->model_details);
                uVar23 = 0xffffffff;
                if (1 < ppuVar15[uVar52][uVar31 + 1]) {
                  uVar23 = (uint)*(short *)(*(long *)(&pvVar9->type + uVar52 * 2) + 2 + uVar31 * 2);
                }
                sVar33 = *(short *)((long)pvVar29 + uVar52 * 2);
                if ((int)(uVar23 | (int)sVar33) < 0) {
                  if (-1 < (int)uVar23) {
                    piVar32 = pvVar7->dangle5[uVar24] + uVar23;
                    goto LAB_0011c4a9;
                  }
                  paaiVar43 = (int (*) [5] [5])pvVar7->dangle3;
                  uVar23 = uVar24;
                  if (-1 < sVar33) goto LAB_0011c483;
                  iVar44 = 0;
                }
                else {
                  paaiVar43 = pvVar7->mismatchExt + uVar24;
LAB_0011c483:
                  piVar32 = (*paaiVar43)[uVar23] + (uint)(int)sVar33;
LAB_0011c4a9:
                  iVar44 = *piVar32;
                }
                if (2 < uVar24) {
                  iVar44 = iVar44 + pvVar7->TerminalAU;
                }
                piVar32 = (int *)((long)pvVar28 + uVar31 * 4);
                *piVar32 = *piVar32 + iVar44;
                uVar52 = uVar52 + 1;
              } while (uVar46 != uVar52);
            }
            uVar31 = uVar31 - 1;
            lVar45 = lVar45 + -1;
          } while (2 < iVar48);
        }
        if ((code *)puVar19 != (code *)0x0 && 1 < (int)uVar47) {
          iVar48 = iVar35 - uVar34;
          iVar44 = iVar50 - uVar34;
          piVar32 = (int *)((long)pvVar28 + (ulong)(uVar53 - uVar34) * 4);
          do {
            if (*piVar32 != 10000000) {
              iVar38 = (*(code *)puVar19)(uVar51,iVar44,iVar48,&local_e8);
              *piVar32 = *piVar32 + iVar38;
            }
            iVar48 = iVar48 + -1;
            iVar44 = iVar44 + -1;
            piVar32 = piVar32 + -1;
          } while (2 < iVar48);
        }
        *(undefined4 *)((long)pvVar28 + 4) = 10000000;
        iVar48 = local_88[uVar51 - 1];
        if ((piVar11[(long)iVar48 + 2] != 10000000) &&
           (uVar20 = (*evaluate)(1,iVar35,2,iVar42,'\x0e',&local_70), uVar20 != '\0')) {
          *(int *)((long)pvVar28 + 4) = piVar11[(long)iVar48 + 2];
          if (uVar46 != 0) {
            uVar31 = 0;
            do {
              uVar34 = vrna_get_ptype_md((int)*(short *)(*(long *)(pcVar13 + uVar31 * 8) + 4),
                                         (int)*(short *)((long)pvVar30 + uVar31 * 2),
                                         &pvVar7->model_details);
              uVar47 = 0xffffffff;
              if (1 < ppuVar15[uVar31][2]) {
                uVar47 = (uint)*(short *)(*(long *)(&pvVar9->type + uVar31 * 2) + 4);
              }
              sVar33 = *(short *)((long)pvVar29 + uVar31 * 2);
              if ((int)(uVar47 | (int)sVar33) < 0) {
                if (-1 < (int)uVar47) {
                  piVar32 = pvVar7->dangle5[uVar34] + uVar47;
                  goto LAB_0011c689;
                }
                if (-1 < sVar33) {
                  paiVar41 = pvVar7->dangle3 + uVar34;
                  goto LAB_0011c66f;
                }
                iVar48 = 0;
              }
              else {
                paiVar41 = pvVar7->mismatchExt[uVar34] + uVar47;
LAB_0011c66f:
                piVar32 = *paiVar41 + (uint)(int)sVar33;
LAB_0011c689:
                iVar48 = *piVar32;
              }
              if (2 < uVar34) {
                iVar48 = iVar48 + pvVar7->TerminalAU;
              }
              *(int *)((long)pvVar28 + 4) = *(int *)((long)pvVar28 + 4) + iVar48;
              uVar31 = uVar31 + 1;
            } while (uVar46 != uVar31);
          }
          if ((code *)puVar18 != (code *)0x0) {
            iVar42 = (*(code *)puVar18)(uVar51,2,iVar42,&local_e8);
            *(int *)((long)pvVar28 + 4) = *(int *)((long)pvVar28 + 4) + iVar42;
          }
        }
        free(pvVar29);
        free(pvVar30);
      }
      else if (fc->type == VRNA_FC_TYPE_SINGLE) {
        psVar12 = (fc->field_23).field_0.sequence_encoding;
        pcVar13 = (fc->field_23).field_0.ptype;
        uVar1 = psVar12[uVar51];
        uVar47 = (uint)(short)uVar1;
        local_88 = piVar32;
        if (1 < (int)(~uVar34 + iVar35)) {
          local_38 = (int (*) [5] [5])pvVar7->dangle3;
          iVar48 = (iVar48 + iVar35) - uVar34;
          iVar44 = iVar35 - uVar34;
          lVar45 = local_80 + (long)(int)uVar34 * -2;
          lVar55 = 0;
          do {
            *(undefined4 *)((long)pvVar28 + lVar55 * 4 + (ulong)(uVar53 - uVar34) * 4) = 10000000;
            if (piVar11[iVar48 + lVar55] != 10000000) {
              uVar20 = (*evaluate)(1,iVar35,(iVar50 - uVar34) + (int)lVar55,iVar44,'\x13',&local_70)
              ;
              if (uVar20 != '\0') {
                uVar23 = vrna_get_ptype(iVar48 + (int)lVar55,pcVar13);
                uVar2 = *(ushort *)((long)psVar12 + lVar55 * 2 + lVar45);
                if ((short)(uVar2 | uVar1) < 0) {
                  if (-1 < (short)uVar2) {
                    piVar32 = pvVar7->dangle5[uVar23] + (uint)(int)(short)uVar2;
                    goto LAB_0011c11b;
                  }
                  paaiVar43 = local_38;
                  uVar24 = uVar23;
                  if (-1 < (short)uVar1) goto LAB_0011c0ef;
                  iVar38 = 0;
                }
                else {
                  paaiVar43 = pvVar7->mismatchExt + uVar23;
                  uVar24 = (int)(short)uVar2;
LAB_0011c0ef:
                  piVar32 = (*paaiVar43)[uVar24] + uVar47;
LAB_0011c11b:
                  iVar38 = *piVar32;
                }
                if (2 < uVar23) {
                  iVar38 = iVar38 + pvVar7->TerminalAU;
                }
                *(int *)((long)pvVar28 + lVar55 * 4 + (ulong)(uVar53 - uVar34) * 4) =
                     iVar38 + piVar11[iVar48 + lVar55];
              }
            }
            lVar55 = lVar55 + -1;
            iVar44 = iVar44 + -1;
          } while (2 < iVar44);
        }
        if ((code *)puVar19 != (code *)0x0 && 1 < (int)(~uVar34 + iVar35)) {
          iVar48 = iVar35 - uVar34;
          iVar44 = iVar50 - uVar34;
          piVar32 = (int *)((long)pvVar28 + (ulong)(uVar53 - uVar34) * 4);
          do {
            if (*piVar32 != 10000000) {
              iVar38 = (*(code *)puVar19)(uVar51,iVar44,iVar48,&local_e8);
              *piVar32 = *piVar32 + iVar38;
            }
            iVar48 = iVar48 + -1;
            iVar44 = iVar44 + -1;
            piVar32 = piVar32 + -1;
          } while (2 < iVar48);
        }
        *(undefined4 *)((long)pvVar28 + 4) = 10000000;
        iVar48 = local_88[uVar51 - 1];
        if ((piVar11[(long)iVar48 + 2] != 10000000) &&
           (uVar20 = (*evaluate)(1,iVar35,2,iVar42,'\x0e',&local_70), uVar20 != '\0')) {
          uVar34 = vrna_get_ptype(iVar48 + 2,pcVar13);
          uVar2 = psVar12[1];
          if ((short)(uVar2 | uVar1) < 0) {
            if (-1 < (short)uVar2) {
              piVar32 = pvVar7->dangle5[uVar34] + (uint)(int)(short)uVar2;
              goto LAB_0011c9d7;
            }
            if (-1 < (short)uVar1) {
              piVar32 = pvVar7->dangle3[uVar34] + uVar47;
              goto LAB_0011c9d7;
            }
            iVar44 = 0;
          }
          else {
            piVar32 = pvVar7->mismatchExt[uVar34][(uint)(int)(short)uVar2] + uVar47;
LAB_0011c9d7:
            iVar44 = *piVar32;
          }
          if (2 < uVar34) {
            iVar44 = iVar44 + pvVar7->TerminalAU;
          }
          *(int *)((long)pvVar28 + 4) = iVar44 + piVar11[(long)iVar48 + 2];
          if ((code *)puVar18 != (code *)0x0) {
            iVar42 = (*(code *)puVar18)(uVar51,2,iVar42,&local_e8);
            *(int *)((long)pvVar28 + 4) = *(int *)((long)pvVar28 + 4) + iVar42;
          }
        }
      }
      if (iVar37 < iVar49) {
        iVar49 = iVar37;
      }
      if (iVar36 < iVar21) {
        iVar21 = iVar36;
      }
      if (iVar26 < iVar22) {
        iVar22 = iVar26;
      }
      iVar54 = vrna_fun_zip_add_min
                         ((fc->matrices->field_2).field_0.f5 + 1,(int *)((long)pvVar28 + 8),
                          iVar54 - (fc->params->model_details).min_loop_size);
      iVar26 = *(int *)((long)pvVar28 + 4);
      if (iVar54 < *(int *)((long)pvVar28 + 4)) {
        iVar26 = iVar54;
      }
      if (iVar21 <= iVar22) {
        iVar22 = iVar21;
      }
      if (iVar49 <= iVar22) {
        iVar22 = iVar49;
      }
      free(pvVar28);
      if (iVar26 <= iVar22) {
        iVar22 = iVar26;
      }
      if (piVar6[uVar51] <= iVar22) {
        iVar22 = piVar6[uVar51];
      }
      if (9999999 < iVar22) {
        iVar22 = 10000000;
      }
      piVar6[uVar51] = iVar22;
      if (iVar4 != 0) {
        piVar32 = (fc->matrices->field_2).field_0.ggg;
        uVar34 = (fc->params->model_details).min_loop_size;
        iVar21 = 10000000;
        if (1 < (int)(~uVar34 + iVar35)) {
          iVar26 = iVar35 - uVar34;
          iVar21 = 10000000;
          lVar45 = 0;
          do {
            iVar54 = *(int *)((long)(fc->matrices->field_2).field_0.f5 +
                             lVar45 + (ulong)(uVar53 - uVar34) * 4 + -4);
            if (((iVar54 != 10000000) &&
                (iVar49 = *(int *)((long)piVar32 +
                                  lVar45 + (long)(int)((fc->jindx[uVar51] + uVar53) - uVar34) * 4),
                iVar49 != 10000000)) && (iVar49 = iVar49 + iVar54, iVar49 <= iVar21)) {
              iVar21 = iVar49;
            }
            lVar45 = lVar45 + -4;
            iVar26 = iVar26 + -1;
          } while (2 < iVar26);
        }
        iVar26 = piVar32[(long)fc->jindx[uVar51] + 1];
        if (iVar21 < iVar26) {
          iVar26 = iVar21;
        }
        if (iVar22 < iVar26) {
          iVar26 = iVar22;
        }
        piVar6[uVar51] = iVar26;
      }
      if ((pvVar8 != (vrna_gr_aux_t *)0x0) && (pvVar8->cb_aux_f != (vrna_callback_gr_rule *)0x0)) {
        iVar22 = (*pvVar8->cb_aux_f)(fc,1,iVar35,pvVar8->data);
        if (piVar6[uVar51] < iVar22) {
          iVar22 = piVar6[uVar51];
        }
        piVar6[uVar51] = iVar22;
      }
      uVar51 = uVar51 + 1;
      local_1b8 = (ulong)(iVar50 + 1);
      local_80 = local_80 + 2;
    } while (local_74 != (int)uVar51);
  }
  free(local_e8.up_comparative);
  free(local_e8.user_cb_comparative);
  free(local_e8.user_data_comparative);
  return piVar6[(int)uVar3];
}

Assistant:

PUBLIC int
vrna_E_ext_loop_5(vrna_fold_compound_t *fc)
{
  if (fc) {
    int                       en, j, length, *f5, dangle_model, with_gquad, turn;
    vrna_param_t              *P;
    vrna_callback_hc_evaluate *evaluate;
    struct default_data       hc_dat_local;
    struct sc_wrapper_f5      sc_wrapper;
    vrna_gr_aux_t             *grammar;

    length        = (int)fc->length;
    f5            = fc->matrices->f5;
    P             = fc->params;
    dangle_model  = P->model_details.dangles;
    with_gquad    = P->model_details.gquad;
    turn          = P->model_details.min_loop_size;
    grammar       = fc->aux_grammar;
    evaluate      = prepare_hc_default(fc, &hc_dat_local);

    init_sc_wrapper(fc, &sc_wrapper);

    f5[0] = 0;
    for (j = 1; j <= turn + 1; j++)
      f5[j] = reduce_f5_up(fc, j, evaluate, &hc_dat_local, &sc_wrapper);

    if ((grammar) && (grammar->cb_aux_f)) {
      for (j = 1; j <= turn + 1; j++) {
        en    = grammar->cb_aux_f(fc, 1, j, grammar->data);
        f5[j] = MIN2(f5[j], en);
      }
    }

    /*
     *  duplicated code may be faster than conditions inside loop or even
     *  using a function pointer ;)
     */
    switch (dangle_model) {
      case 2:
        for (j = turn + 2; j <= length; j++) {
          /* extend previous solution(s) by adding an unpaired region */
          f5[j] = reduce_f5_up(fc, j, evaluate, &hc_dat_local, &sc_wrapper);

          /* decompose into exterior loop part followed by a stem */
          en    = decompose_f5_ext_stem_d2(fc, j, evaluate, &hc_dat_local, &sc_wrapper);
          f5[j] = MIN2(f5[j], en);

          if (with_gquad) {
            en    = add_f5_gquad(fc, j, evaluate, &hc_dat_local, &sc_wrapper);
            f5[j] = MIN2(f5[j], en);
          }

          if ((grammar) && (grammar->cb_aux_f)) {
            en    = grammar->cb_aux_f(fc, 1, j, grammar->data);
            f5[j] = MIN2(f5[j], en);
          }
        }
        break;

      case 0:
        for (j = turn + 2; j <= length; j++) {
          /* extend previous solution(s) by adding an unpaired region */
          f5[j] = reduce_f5_up(fc, j, evaluate, &hc_dat_local, &sc_wrapper);

          /* decompose into exterior loop part followed by a stem */
          en    = decompose_f5_ext_stem_d0(fc, j, evaluate, &hc_dat_local, &sc_wrapper);
          f5[j] = MIN2(f5[j], en);

          if (with_gquad) {
            en    = add_f5_gquad(fc, j, evaluate, &hc_dat_local, &sc_wrapper);
            f5[j] = MIN2(f5[j], en);
          }

          if ((grammar) && (grammar->cb_aux_f)) {
            en    = grammar->cb_aux_f(fc, 1, j, grammar->data);
            f5[j] = MIN2(f5[j], en);
          }
        }
        break;

      default:
        for (j = turn + 2; j <= length; j++) {
          /* extend previous solution(s) by adding an unpaired region */
          f5[j] = reduce_f5_up(fc, j, evaluate, &hc_dat_local, &sc_wrapper);

          en    = decompose_f5_ext_stem_d1(fc, j, evaluate, &hc_dat_local, &sc_wrapper);
          f5[j] = MIN2(f5[j], en);

          if (with_gquad) {
            en    = add_f5_gquad(fc, j, evaluate, &hc_dat_local, &sc_wrapper);
            f5[j] = MIN2(f5[j], en);
          }

          if ((grammar) && (grammar->cb_aux_f)) {
            en    = grammar->cb_aux_f(fc, 1, j, grammar->data);
            f5[j] = MIN2(f5[j], en);
          }
        }
        break;
    }

    free_sc_wrapper(&sc_wrapper);

    return f5[length];
  }

  return INF;
}